

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool __thiscall LTOnlineChannel::FetchAllData(LTOnlineChannel *this,positionTy *pos)

{
  _func_int **pp_Var1;
  size_type sVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  logLevelTy lVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  undefined8 in_RSI;
  LTChannel *in_RDI;
  float fVar10;
  bool in_stack_0000007f;
  long in_stack_00000080;
  char *in_stack_00000088;
  LTOnlineChannel *in_stack_00000090;
  float now;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tEnd;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStart;
  string url;
  CURLcode cc;
  DataRefs *in_stack_fffffffffffffe88;
  undefined4 uVar11;
  allocator<char> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string *in_stack_ffffffffffffff08;
  bool local_d5;
  allocator<char> local_89;
  string local_88 [8];
  string local_40 [36];
  uint local_1c;
  undefined8 local_18;
  byte local_1;
  
  local_1c = 0;
  local_18 = in_RSI;
  uVar4 = (*in_RDI->_vptr_LTChannel[0x12])();
  if ((uVar4 & 1) == 0) {
    local_1 = 0;
  }
  else {
    (*in_RDI->_vptr_LTChannel[0x14])(local_40,in_RDI,local_18);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      (*in_RDI->_vptr_LTChannel[0x15])(in_RDI,local_18);
      pp_Var1 = in_RDI[1]._vptr_LTChannel;
      uVar8 = std::__cxx11::string::c_str();
      curl_easy_setopt(pp_Var1,0x2712,uVar8);
      curl_easy_setopt(in_RDI[1]._vptr_LTChannel,0x62,
                       in_RDI[1].urlName.field_2._M_allocated_capacity);
      pp_Var1 = in_RDI[1]._vptr_LTChannel;
      iVar5 = DataRefs::GetNetwTimeoutMax(&dataRefs);
      curl_easy_setopt(pp_Var1,0xd,iVar5);
      curl_easy_setopt(in_RDI[1]._vptr_LTChannel,0x2c,0);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pp_Var1 = in_RDI[1]._vptr_LTChannel;
        uVar8 = std::__cxx11::string::data();
        curl_easy_setopt(pp_Var1,0x271f,uVar8);
      }
      else {
        curl_easy_setopt(in_RDI[1]._vptr_LTChannel,0x50,1);
      }
      in_RDI[1].urlName._M_string_length = 0;
      **(undefined1 **)&in_RDI[1].urlName = 0;
      std::__cxx11::string::c_str();
      DebugLogRaw(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007f);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::__cxx11::string::c_str();
        DebugLogRaw(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007f);
      }
      std::chrono::_V2::steady_clock::now();
      in_RDI[3].urlLink._M_string_length = 0;
      local_1c = curl_easy_perform(in_RDI[1]._vptr_LTChannel);
      std::chrono::_V2::steady_clock::now();
      local_d5 = false;
      if (local_1c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffed0,
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec0);
        local_d5 = IsRevocationError(in_stack_ffffffffffffff08);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
      }
      if (local_d5 != false) {
        curl_easy_setopt(in_RDI[1]._vptr_LTChannel,0xd8,2);
        lVar6 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar6 < 3) {
          pcVar9 = LTChannel::ChName(in_RDI);
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
                 ,0x31c,"FetchAllData",logWARN,
                 "%s: Querying revocation list failed - have set CURLSSLOPT_NO_REVOKE and am trying again"
                 ,pcVar9);
        }
        std::chrono::_V2::steady_clock::now();
        local_1c = curl_easy_perform(in_RDI[1]._vptr_LTChannel);
        std::chrono::_V2::steady_clock::now();
      }
      if (local_1c == 0) {
        curl_easy_getinfo(in_RDI[1]._vptr_LTChannel,0x200002,&in_RDI[3].urlLink._M_string_length);
        sVar2 = in_RDI[3].urlLink._M_string_length;
        if (sVar2 != 200) {
          if (sVar2 == 0x194) {
            lVar6 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar6 < 1) {
              pcVar9 = LTChannel::ChName(in_RDI);
              sVar2 = in_RDI[3].urlLink._M_string_length;
              uVar8 = std::__cxx11::string::c_str();
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
                     ,0x33f,"FetchAllData",logDEBUG,"%s: HTTP response is not OK but %ld for %s",
                     pcVar9,sVar2,uVar8);
            }
          }
          else {
            lVar6 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar6 < 3) {
              pcVar9 = LTChannel::ChName(in_RDI);
              sVar2 = in_RDI[3].urlLink._M_string_length;
              uVar8 = std::__cxx11::string::c_str();
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
                     ,0x344,"FetchAllData",logWARN,"%s: HTTP response is not OK but %ld for %s",
                     pcVar9,sVar2,uVar8);
            }
          }
        }
        DebugLogRaw(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007f);
        local_1 = 1;
      }
      else {
        if (local_1c == 0x1c) {
          fVar10 = DataRefs::GetMiscNetwTime(in_stack_fffffffffffffe88);
          uVar11 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
          fVar3 = FetchAllData::tLastMsg;
          if ((FetchAllData::tLastMsg + 180.0 < fVar10) &&
             (lVar6 = DataRefs::GetLogLevel(&dataRefs), fVar3 = fVar10, (int)lVar6 < 3)) {
            pcVar9 = LTChannel::ChName(in_RDI);
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
                   ,0x32c,"FetchAllData",logWARN,"%s: Could not get network data: %d - %s",pcVar9,
                   CONCAT44(uVar11,local_1c),(undefined1 *)((long)&in_RDI[1].urlName.field_2 + 8));
          }
        }
        else {
          lVar6 = DataRefs::GetLogLevel(&dataRefs);
          uVar11 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
          if ((int)lVar6 < 4) {
            pcVar9 = LTChannel::ChName(in_RDI);
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
                   ,0x330,"FetchAllData",logERR,"%s: Could not get network data: %d - %s",pcVar9,
                   CONCAT44(uVar11,local_1c),(undefined1 *)((long)&in_RDI[1].urlName.field_2 + 8));
          }
          pcVar9 = LTChannel::ChName(in_RDI);
          CreateMsgWindow(12.0,logERR,"%s: Could not get network data: %d - %s",pcVar9,
                          (ulong)local_1c,(undefined1 *)((long)&in_RDI[1].urlName.field_2 + 8));
          (*in_RDI->_vptr_LTChannel[8])();
          fVar3 = FetchAllData::tLastMsg;
        }
        FetchAllData::tLastMsg = fVar3;
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
    std::__cxx11::string::~string(local_40);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LTOnlineChannel::FetchAllData (const positionTy& pos)
{
    CURLcode cc = CURLE_OK;

    // make sure CURL is initialized
    if ( !InitCurl() ) return false;
    
    // ask for the URL
    std::string url (GetURL(pos));
    
    // no url -> don't query
    if (url.empty())
        return false;
    
    // ask for a body of a POST request (to be put into requBody)
    ComputeBody(pos);
    
    // put together the REST request
    curl_easy_setopt(pCurl, CURLOPT_URL, url.c_str());
    curl_easy_setopt(pCurl, CURLOPT_BUFFERSIZE, netDataSize );
    curl_easy_setopt(pCurl, CURLOPT_TIMEOUT, dataRefs.GetNetwTimeoutMax());

    // Set up the request
    curl_easy_setopt(pCurl, CURLOPT_NOBODY,  0);
    if (requBody.empty())
        // HTTPS GET
        curl_easy_setopt(pCurl, CURLOPT_HTTPGET, 1);
    else
        // HTTPS POST
        curl_easy_setopt(pCurl, CURLOPT_POSTFIELDS, requBody.data());
    
    // get fresh data via the internet
    // this will take a second or more...don't try in render loop ;)
    // it is assumed that this is called in a separate thread,
    // hence we can use the simple blocking curl_easy_ call
    netDataPos = 0;                 // fill buffer from beginning
    netData[0] = 0;
    DebugLogRaw(url.c_str(), HTTP_FLAG_SENDING);
    if (!requBody.empty())
        DebugLogRaw(requBody.c_str(), HTTP_FLAG_SENDING, false);
    
    // perform the request and take its time
    std::chrono::time_point<std::chrono::steady_clock> tStart = std::chrono::steady_clock::now();
    httpResponse = 0;
    cc=curl_easy_perform(pCurl);
    std::chrono::time_point<std::chrono::steady_clock> tEnd = std::chrono::steady_clock::now();

    // Give it another try in case of revocation list issues
    if ( cc != CURLE_OK && IsRevocationError(curl_errtxt)) {
        // try not to query revoke list
        curl_easy_setopt(pCurl, CURLOPT_SSL_OPTIONS, CURLSSLOPT_NO_REVOKE);
        LOG_MSG(logWARN, ERR_CURL_DISABLE_REV_QU, ChName());
        // and just give it another try
        tStart = std::chrono::steady_clock::now();
        cc = curl_easy_perform(pCurl);
        tEnd = std::chrono::steady_clock::now();
    }

    // if (still) error, then log error and bail out
    if (cc != CURLE_OK) {
        
        // In case of timeout increase the channel's timeout and don't count it as an error
        if (cc == CURLE_OPERATION_TIMEDOUT) {
            // But bother the user only with messages once every 3 minutes (this is due to OpenSky having been plagued with slow API responses running into timeouts)
            static float tLastMsg = 0.0f;                   // time last message was logged
            const float now = dataRefs.GetMiscNetwTime();
            if (tLastMsg + 180.0f < now) {
                LOG_MSG(logWARN, ERR_CURL_PERFORM, ChName(), cc, curl_errtxt);
                tLastMsg = now;
            }
        } else {
            SHOW_MSG(logERR, ERR_CURL_PERFORM, ChName(), cc, curl_errtxt);
            IncErrCnt();
        }
        
        return false;
    }

    // check HTTP response code
    curl_easy_getinfo(pCurl, CURLINFO_RESPONSE_CODE, &httpResponse);
    switch (httpResponse) {
        case HTTP_OK:
            break;

        case HTTP_NOT_FOUND:
            // not found is typically handled separately, so only debug-level
            LOG_MSG(logDEBUG,ERR_CURL_HTTP_RESP,ChName(),httpResponse, url.c_str());
            break;
            
        default:
            // all other responses are warnings
            LOG_MSG(logWARN,ERR_CURL_HTTP_RESP,ChName(),httpResponse, url.c_str());
    }
    
    // if requested log raw data received
    DebugLogRaw(netData, httpResponse);
    
    // success
    return true;
}